

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVarious.hpp
# Opt level: O3

void __thiscall Omega_invoke_Test::TestBody(Omega_invoke_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  char *message;
  AssertionResult gtest_ar;
  ostringstream result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  AssertHelper local_1a0;
  allocator local_198 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__cxx11::string::string((string *)&local_1c0,"yuppi!",local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"a=",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_188,6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", b=",4);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", n=",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[19]>
            ((internal *)local_198,"result.str()","\"a=6, b=7, n=yuppi!\"",&local_1c0,
             (char (*) [19])"a=6, b=7, n=yuppi!");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if (local_198[0] == (allocator)0x0) {
    testing::Message::Message((Message *)&local_1c0);
    if (local_190.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_190.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/meox[P]omega/Test/TestVarious.hpp"
               ,0x1d,message);
    testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    if ((long *)local_1c0._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_1c0._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1c0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_190,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

TEST(Omega, invoke)
{
    std::ostringstream result;
    auto function = [&result](int a, int b, std::string const &n)
    {
        result << "a=" << a << ", b=" << b << ", n=" << n;
    };

    auto const t1 = omega::make_list<1, 3>(t);

    omega::invoke(function, t1);
    EXPECT_EQ(result.str(), "a=6, b=7, n=yuppi!");

}